

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzfmatrix.cpp
# Opt level: O3

TPZFMatrix<long_double> * __thiscall
TPZFMatrix<long_double>::operator-=(TPZFMatrix<long_double> *this,TPZMatrix<long_double> *aBase)

{
  longdouble *plVar1;
  long lVar2;
  long lVar3;
  long lVar4;
  
  lVar2 = __dynamic_cast(aBase,&TPZMatrix<long_double>::typeinfo,&typeinfo,0);
  if (lVar2 == 0) {
    Error("TPZFMatrix<TVar> &TPZFMatrix<long double>::operator-=(const TPZMatrix<TVar> &) [TVar = long double]"
          ," incompatible argument");
  }
  lVar4 = *(long *)(lVar2 + 8);
  if ((lVar4 != (this->super_TPZMatrix<long_double>).super_TPZBaseMatrix.fRow) ||
     (lVar3 = *(long *)(lVar2 + 0x10),
     lVar3 != (this->super_TPZMatrix<long_double>).super_TPZBaseMatrix.fCol)) {
    Error("Operator-= <matrixs with different dimensions>",(char *)0x0);
    lVar4 = (this->super_TPZMatrix<long_double>).super_TPZBaseMatrix.fRow;
    lVar3 = (this->super_TPZMatrix<long_double>).super_TPZBaseMatrix.fCol;
  }
  lVar3 = lVar3 * lVar4;
  if (0 < lVar3) {
    lVar2 = *(long *)(lVar2 + 0x20);
    plVar1 = this->fElem;
    lVar4 = 0;
    do {
      *(longdouble *)((long)plVar1 + lVar4) =
           *(longdouble *)((long)plVar1 + lVar4) - *(longdouble *)(lVar2 + lVar4);
      lVar4 = lVar4 + 0x10;
      lVar3 = lVar3 + -1;
    } while (lVar3 != 0);
  }
  return this;
}

Assistant:

TPZFMatrix<TVar> &TPZFMatrix<TVar>::operator-=(const TPZMatrix<TVar> &aBase ) {
    auto A = dynamic_cast<const TPZFMatrix<TVar>*>(&aBase);
    if(!A){
        Error(__PRETTY_FUNCTION__," incompatible argument");
    }
    if ( (A->Rows() != this->Rows())  ||  (A->Cols() != this->Cols()) )
        Error( "Operator-= <matrixs with different dimensions>" );
    
    int64_t size = ((int64_t)this->Rows()) * this->Cols();
    TVar * pm = fElem;
    TVar * pa = A->fElem;
    
    for ( int64_t i = 0; i < size; i++ ) *pm++ -= *pa++;
    
    return( *this );
}